

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

int png_image_free_function(png_voidp argument)

{
  long *ptr;
  long lVar1;
  FILE *__stream;
  int iVar2;
  png_control c;
  png_const_structrp local_48;
  png_info *ppStack_40;
  long local_38;
  long lStack_30;
  long local_28;
  ulong uStack_20;
  
  ptr = *argument;
  lVar1 = *ptr;
  if (lVar1 == 0) {
    iVar2 = 0;
  }
  else {
    if ((*(byte *)(ptr + 5) & 2) != 0) {
      __stream = *(FILE **)(lVar1 + 0x108);
      *(byte *)(ptr + 5) = *(byte *)(ptr + 5) & 0xfd;
      if (__stream != (FILE *)0x0) {
        *(undefined8 *)(lVar1 + 0x108) = 0;
        fclose(__stream);
      }
    }
    local_48 = (png_const_structrp)*ptr;
    ppStack_40 = (png_info *)ptr[1];
    local_38 = ptr[2];
    lStack_30 = ptr[3];
    local_28 = ptr[4];
    uStack_20 = ptr[5];
    *(png_const_structrp **)argument = &local_48;
    png_free(local_48,ptr);
    if ((uStack_20 & 1) == 0) {
      png_destroy_read_struct(&local_48,&ppStack_40,(png_infopp)0x0);
    }
    else {
      png_destroy_write_struct(&local_48,&ppStack_40);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
png_image_free_function(png_voidp argument)
{
   png_imagep image = png_voidcast(png_imagep, argument);
   png_controlp cp = image->opaque;
   png_control c;

   /* Double check that we have a png_ptr - it should be impossible to get here
    * without one.
    */
   if (cp->png_ptr == NULL)
      return 0;

   /* First free any data held in the control structure. */
#  ifdef PNG_STDIO_SUPPORTED
      if (cp->owned_file != 0)
      {
         FILE *fp = png_voidcast(FILE*, cp->png_ptr->io_ptr);
         cp->owned_file = 0;

         /* Ignore errors here. */
         if (fp != NULL)
         {
            cp->png_ptr->io_ptr = NULL;
            (void)fclose(fp);
         }
      }
#  endif

   /* Copy the control structure so that the original, allocated, version can be
    * safely freed.  Notice that a png_error here stops the remainder of the
    * cleanup, but this is probably fine because that would indicate bad memory
    * problems anyway.
    */
   c = *cp;
   image->opaque = &c;
   png_free(c.png_ptr, cp);

   /* Then the structures, calling the correct API. */
   if (c.for_write != 0)
   {
#     ifdef PNG_SIMPLIFIED_WRITE_SUPPORTED
         png_destroy_write_struct(&c.png_ptr, &c.info_ptr);
#     else
         png_error(c.png_ptr, "simplified write not supported");
#     endif
   }
   else
   {
#     ifdef PNG_SIMPLIFIED_READ_SUPPORTED
         png_destroy_read_struct(&c.png_ptr, &c.info_ptr, NULL);
#     else
         png_error(c.png_ptr, "simplified read not supported");
#     endif
   }

   /* Success. */
   return 1;
}